

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trie-pfx.c
# Opt level: O1

data_elem * pfx_table_find_elem(node_data *data,pfx_record *record,uint *index)

{
  long lVar1;
  data_elem *pdVar2;
  ulong uVar3;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if ((ulong)data->len != 0) {
    pdVar2 = data->ary;
    uVar3 = 0;
    do {
      if (((pdVar2->asn == record->asn) && (pdVar2->max_len == record->max_len)) &&
         (pdVar2->socket == record->socket)) {
        if (index != (uint *)0x0) {
          *index = (uint)uVar3;
        }
        goto LAB_00105082;
      }
      uVar3 = uVar3 + 1;
      pdVar2 = pdVar2 + 1;
    } while (data->len != uVar3);
  }
  pdVar2 = (data_elem *)0x0;
LAB_00105082:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return pdVar2;
  }
  __stack_chk_fail();
}

Assistant:

struct data_elem *pfx_table_find_elem(const struct node_data *data, const struct pfx_record *record,
				      unsigned int *index)
{
	for (unsigned int i = 0; i < data->len; i++) {
		if (data->ary[i].asn == record->asn && data->ary[i].max_len == record->max_len &&
		    data->ary[i].socket == record->socket) {
			if (index)
				*index = i;
			return &(data->ary[i]);
		}
	}
	return NULL;
}